

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int fits_uncompress_hkdata(ParseData *lParse,fitsfile *fptr,long ntimes,double *times,int *status)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long in_RCX;
  double *in_RDX;
  double *pdVar4;
  long in_RDI;
  int *in_R8;
  double newtime;
  double currtime;
  long currelem;
  long row;
  long naxis2;
  int anynul;
  int parNo;
  char found [1000];
  char *sPtr [1];
  char parName [256];
  char *s2;
  int *s1;
  double local_558;
  double local_550;
  double *array;
  double nulval;
  int *in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad8;
  int in_stack_fffffffffffffadc;
  undefined4 in_stack_fffffffffffffae0;
  int in_stack_fffffffffffffae4;
  fitsfile *in_stack_fffffffffffffae8;
  char **in_stack_fffffffffffffb00;
  int *in_stack_fffffffffffffb08;
  int *in_stack_fffffffffffffb10;
  char local_138 [264];
  int *local_30;
  long local_28;
  double *local_20;
  long local_10;
  int local_4;
  
  array = (double *)0x0;
  local_550 = -1e+38;
  iVar1 = *(int *)(in_RDI + 0x60);
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  while (iVar3 = iVar1 + -1, iVar1 != 0) {
    (&stack0xfffffffffffffad8)[iVar3] = 0;
    iVar1 = iVar3;
  }
  iVar1 = ffgkyj(in_stack_fffffffffffffae8,
                 (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                 (long *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                 (char *)CONCAT44(iVar3,in_stack_fffffffffffffad0),in_stack_fffffffffffffac8);
  if (iVar1 == 0) {
    for (nulval = 4.94065645841247e-324; (long)nulval <= (long)in_stack_fffffffffffffac8;
        nulval = (double)((long)nulval + 1)) {
      iVar1 = ffgcvd(in_stack_fffffffffffffae8,in_stack_fffffffffffffae4,
                     CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                     CONCAT44(iVar3,in_stack_fffffffffffffad0),(LONGLONG)in_stack_fffffffffffffac8,
                     nulval,array,(int *)in_stack_fffffffffffffb00,in_stack_fffffffffffffb08);
      if (iVar1 != 0) {
        return *local_30;
      }
      if ((local_558 != local_550) || (NAN(local_558) || NAN(local_550))) {
        if (array == local_20) {
          ffpmsg((char *)0x13554b);
          *local_30 = 0x1b3;
          return 0x1b3;
        }
        local_550 = local_558;
        pdVar4 = (double *)((long)array + 1);
        *(double *)(local_28 + (long)array * 8) = local_558;
        iVar1 = *(int *)(local_10 + 0x60);
        while (iVar3 = iVar1 + -1, array = pdVar4, iVar1 != 0) {
          iVar2 = *(int *)(*(long *)(local_10 + 0xa0) + 0x54 + (long)iVar3 * 0x110);
          if (iVar2 == 0x10) {
            strcpy(*(char **)(*(long *)(*(long *)(local_10 + 0xa0) + (long)iVar3 * 0x110 + 0x60) +
                             (long)pdVar4 * 8),
                   *(char **)(*(long *)(*(long *)(local_10 + 0xa0) + (long)iVar3 * 0x110 + 0x60) +
                             ((long)pdVar4 + -1) * 8));
            iVar1 = iVar3;
          }
          else {
            iVar1 = iVar3;
            if (iVar2 == 0x29) {
              *(undefined8 *)
               (*(long *)(*(long *)(local_10 + 0xa0) + (long)iVar3 * 0x110 + 0x60) +
               (long)pdVar4 * 8) =
                   *(undefined8 *)
                    (*(long *)(*(long *)(local_10 + 0xa0) + (long)iVar3 * 0x110 + 0x60) +
                    ((long)pdVar4 + -1) * 8);
            }
            else if (iVar2 == 0x52) {
              *(undefined8 *)
               (*(long *)(*(long *)(local_10 + 0xa0) + (long)iVar3 * 0x110 + 0x60) +
               (long)pdVar4 * 8) =
                   *(undefined8 *)
                    (*(long *)(*(long *)(local_10 + 0xa0) + (long)iVar3 * 0x110 + 0x60) +
                    ((long)pdVar4 + -1) * 8);
            }
          }
        }
      }
      s2 = &stack0xfffffffffffffad0;
      s1 = local_30;
      iVar1 = ffgcvs((fitsfile *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                     in_stack_fffffffffffffadc,CONCAT44(iVar3,in_stack_fffffffffffffad0),
                     (LONGLONG)in_stack_fffffffffffffac8,(LONGLONG)nulval,(char *)array,
                     in_stack_fffffffffffffb00,in_stack_fffffffffffffb08,in_stack_fffffffffffffb10);
      if (iVar1 != 0) {
        return *local_30;
      }
      iVar1 = *(int *)(local_10 + 0x60);
      do {
        iVar3 = iVar1 + -1;
        if (iVar1 == 0) break;
        iVar2 = fits_strcasecmp((char *)s1,s2);
        iVar1 = iVar3;
      } while (iVar2 != 0);
      if (-1 < iVar3) {
        (&stack0xfffffffffffffad8)[iVar3] = 1;
        iVar1 = *(int *)(*(long *)(local_10 + 0xa0) + 0x54 + (long)iVar3 * 0x110);
        if (iVar1 == 0x10) {
          ffgcvs((fitsfile *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                 in_stack_fffffffffffffadc,CONCAT44(iVar3,in_stack_fffffffffffffad0),
                 (LONGLONG)in_stack_fffffffffffffac8,(LONGLONG)nulval,(char *)array,
                 in_stack_fffffffffffffb00,in_stack_fffffffffffffb08,in_stack_fffffffffffffb10);
        }
        else if (iVar1 == 0x29) {
          ffgcvj((fitsfile *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                 in_stack_fffffffffffffadc,CONCAT44(iVar3,in_stack_fffffffffffffad0),
                 (LONGLONG)in_stack_fffffffffffffac8,(LONGLONG)nulval,(long)array,
                 (long *)in_stack_fffffffffffffb00,in_stack_fffffffffffffb08,
                 in_stack_fffffffffffffb10);
        }
        else if (iVar1 == 0x52) {
          ffgcvd(in_stack_fffffffffffffae8,in_stack_fffffffffffffae4,
                 CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                 CONCAT44(iVar3,in_stack_fffffffffffffad0),(LONGLONG)in_stack_fffffffffffffac8,
                 nulval,array,(int *)in_stack_fffffffffffffb00,in_stack_fffffffffffffb08);
        }
        if (*local_30 != 0) {
          return *local_30;
        }
      }
    }
    if ((long)array < (long)local_20) {
      ffpmsg((char *)0x135a59);
      *local_30 = 0x1b3;
      local_4 = 0x1b3;
    }
    else {
      iVar1 = *(int *)(local_10 + 0x60);
      while (iVar3 = iVar1 + -1, iVar1 != 0) {
        iVar1 = iVar3;
        if ((&stack0xfffffffffffffad8)[iVar3] == '\0') {
          snprintf(local_138,0x100,"Parameter not found: %-30s",
                   *(long *)(local_10 + 0xa8) + (long)iVar3 * 0xa0);
          ffpmsg((char *)0x135aea);
          *local_30 = 0x1af;
          iVar1 = iVar3;
        }
      }
      local_4 = *local_30;
    }
  }
  else {
    local_4 = *local_30;
  }
  return local_4;
}

Assistant:

int fits_uncompress_hkdata( ParseData *lParse,
		       fitsfile *fptr,
                       long     ntimes,
                       double   *times,
                       int      *status )
/*                                                                           */
/* description                                                               */
/*---------------------------------------------------------------------------*/
{
   char parName[256], *sPtr[1], found[1000];
   int parNo, anynul;
   long naxis2, row, currelem;
   double currtime, newtime;

   sPtr[0] = parName;
   currelem = 0;
   currtime = -1e38;

   parNo=lParse->nCols;
   while( parNo-- ) found[parNo] = 0;

   if( ffgkyj( fptr, "NAXIS2", &naxis2, NULL, status ) ) return( *status );

   for( row=1; row<=naxis2; row++ ) {
      if( ffgcvd( fptr, lParse->timeCol, row, 1L, 1L, 0.0,
                  &newtime, &anynul, status ) ) return( *status );
      if( newtime != currtime ) {
         /*  New time encountered... propogate parameters to next row  */
         if( currelem==ntimes ) {
            ffpmsg("Found more unique time stamps than caller indicated");
            return( *status = PARSE_BAD_COL );
         }
         times[currelem++] = currtime = newtime;
         parNo = lParse->nCols;
         while( parNo-- ) {
            switch( lParse->colData[parNo].datatype ) {
            case TLONG:
               ((long*)lParse->colData[parNo].array)[currelem] =
                  ((long*)lParse->colData[parNo].array)[currelem-1];
               break;
            case TDOUBLE:
               ((double*)lParse->colData[parNo].array)[currelem] =
                  ((double*)lParse->colData[parNo].array)[currelem-1];
               break;
            case TSTRING:
               strcpy( ((char **)lParse->colData[parNo].array)[currelem],
                       ((char **)lParse->colData[parNo].array)[currelem-1] );
               break;
            }
         }
      }

      if( ffgcvs( fptr, lParse->parCol, row, 1L, 1L, "",
                  sPtr, &anynul, status ) ) return( *status );
      parNo = lParse->nCols;
      while( parNo-- )
         if( !fits_strcasecmp( parName, lParse->varData[parNo].name ) ) break;

      if( parNo>=0 ) {
         found[parNo] = 1; /* Flag this parameter as found */
         switch( lParse->colData[parNo].datatype ) {
         case TLONG:
            ffgcvj( fptr, lParse->valCol, row, 1L, 1L,
                    ((long*)lParse->colData[parNo].array)[0],
                    ((long*)lParse->colData[parNo].array)+currelem,
                    &anynul, status );
            break;
         case TDOUBLE:
            ffgcvd( fptr, lParse->valCol, row, 1L, 1L,
                    ((double*)lParse->colData[parNo].array)[0],
                    ((double*)lParse->colData[parNo].array)+currelem,
                    &anynul, status );
            break;
         case TSTRING:
            ffgcvs( fptr, lParse->valCol, row, 1L, 1L,
                    ((char**)lParse->colData[parNo].array)[0],
                    ((char**)lParse->colData[parNo].array)+currelem,
                    &anynul, status );
            break;
         }
         if( *status ) return( *status );
      }
   }

   if( currelem<ntimes ) {
      ffpmsg("Found fewer unique time stamps than caller indicated");
      return( *status = PARSE_BAD_COL );
   }

   /*  Check for any parameters which were not located in the table  */
   parNo = lParse->nCols;
   while( parNo-- )
      if( !found[parNo] ) {
         snprintf( parName, 256, "Parameter not found: %-30s", 
                  lParse->varData[parNo].name );
         ffpmsg( parName );
         *status = PARSE_SYNTAX_ERR;
      }
   return( *status );
}